

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_NtkCreateLevels(Wlc_Ntk_t *p)

{
  Vec_Int_t *p_00;
  int *piVar1;
  Wlc_Obj_t *pWVar2;
  long lVar3;
  int in_EDX;
  long lVar4;
  int iVar5;
  int iVar6;
  
  p_00 = &p->vLevels;
  Vec_IntFill(p_00,p->iObj,in_EDX);
  iVar5 = 1;
  while( true ) {
    iVar6 = p->iObj;
    if (iVar6 <= iVar5) break;
    pWVar2 = Wlc_NtkObj(p,iVar5);
    Wlc_NtkCreateLevels_rec(p,pWVar2);
    iVar5 = iVar5 + 1;
  }
  for (iVar5 = 1; iVar5 < iVar6; iVar5 = iVar5 + 1) {
    pWVar2 = Wlc_NtkObj(p,iVar5);
    if (((undefined1  [24])((undefined1  [24])*pWVar2 & (undefined1  [24])0x3d) !=
         (undefined1  [24])0x1) && (pWVar2->nFanins != 0)) {
      Vec_IntAddToEntry(p_00,iVar5,1);
    }
    iVar6 = p->iObj;
  }
  lVar3 = (long)(p->vLevels).nSize;
  if (lVar3 == 0) {
    iVar5 = 1;
  }
  else {
    piVar1 = (p->vLevels).pArray;
    iVar5 = *piVar1;
    for (lVar4 = 1; lVar4 < lVar3; lVar4 = lVar4 + 1) {
      iVar6 = piVar1[lVar4];
      if (iVar5 <= iVar6) {
        iVar5 = iVar6;
      }
    }
    iVar5 = iVar5 + 1;
  }
  for (iVar6 = 0; iVar6 < (p->vFfs2).nSize; iVar6 = iVar6 + 1) {
    pWVar2 = Wlc_NtkFf2(p,iVar6);
    Vec_IntWriteEntry(p_00,(int)(((long)pWVar2 - (long)p->pObjs) / 0x18),iVar5);
  }
  return iVar5;
}

Assistant:

int Wlc_NtkCreateLevels( Wlc_Ntk_t * p )
{
    Wlc_Obj_t * pObj;  int i, LeveMax = 0;
    Vec_IntFill( &p->vLevels, Wlc_NtkObjNumMax(p), 0 );
    Wlc_NtkForEachObj( p, pObj, i )
        Wlc_NtkCreateLevels_rec( p, pObj );
    Wlc_NtkForEachObj( p, pObj, i )
        if ( !Wlc_ObjIsCi(pObj) && Wlc_ObjFaninNum(pObj) )
            Vec_IntAddToEntry( &p->vLevels, i, 1 );
    LeveMax = Vec_IntFindMax( &p->vLevels );
    Wlc_NtkForEachFf2( p, pObj, i )
        Vec_IntWriteEntry( &p->vLevels, Wlc_ObjId(p, pObj), LeveMax+1 );
    //Wlc_NtkPrintObjects( p ); 
    return LeveMax+1;
}